

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.hpp
# Opt level: O2

string * __thiscall czh::token::Pos::get_code_abi_cxx11_(string *__return_storage_ptr__,Pos *this)

{
  long lVar1;
  element_type *peVar2;
  string *psVar3;
  size_type sVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar8;
  long lVar9;
  unsigned_long uVar10;
  bool bVar11;
  string arrow;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string *local_78;
  string temp1;
  string temp2;
  long lVar7;
  
  peVar2 = (this->code).super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_78 = __return_storage_ptr__;
  iVar5 = (*peVar2->_vptr_File[1])(peVar2,this->pos);
  lVar7 = CONCAT44(extraout_var,iVar5);
  std::__cxx11::to_string(&temp1,lVar7 + 3U);
  sVar4 = temp1._M_string_length;
  std::__cxx11::string::~string((string *)&temp1);
  peVar2 = (this->code).super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar6 = (*peVar2->_vptr_File[4])(peVar2);
  iVar6 = (*peVar2->_vptr_File[1])(peVar2,CONCAT44(extraout_var_00,iVar6) + -1);
  lVar8 = 4;
  do {
    lVar1 = lVar8 + -1;
    if (lVar8 == 1) break;
    lVar8 = lVar1;
  } while (iVar5 <= lVar1);
  lVar8 = 0;
  uVar10 = lVar7 + 3U;
  do {
    lVar9 = lVar8 + 1;
    if (lVar8 == 3) break;
    bVar11 = CONCAT44(extraout_var_01,iVar6) <= uVar10;
    lVar8 = lVar9;
    uVar10 = uVar10 - 1;
  } while (bVar11);
  temp1._M_dataplus._M_p = (pointer)&temp1.field_2;
  temp1._M_string_length = 0;
  temp2._M_dataplus._M_p = (pointer)&temp2.field_2;
  temp2._M_string_length = 0;
  temp1.field_2._M_local_buf[0] = '\0';
  temp2.field_2._M_local_buf[0] = '\0';
  peVar2 = (this->code).super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (**peVar2->_vptr_File)(&arrow,peVar2,lVar7 - lVar1,lVar7 + 1,sVar4);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&temp1,&arrow);
  std::__cxx11::string::~string((string *)&arrow);
  if (lVar9 != 4) {
    peVar2 = (this->code).super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (**peVar2->_vptr_File)(&arrow,peVar2,lVar7 + 1,(lVar7 - lVar9) + 5,sVar4);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&temp2,&arrow);
    std::__cxx11::string::~string((string *)&arrow);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&arrow,"\n",(allocator<char> *)&local_98);
  peVar2 = (this->code).super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar5 = (*peVar2->_vptr_File[2])(peVar2,this->pos);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_98,(CONCAT44(extraout_var_02,iVar5) + sVar4) - this->size,' ');
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&arrow,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&arrow,"\x1b[0;32;32m");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
            (&arrow,(const_iterator)(arrow._M_dataplus._M_p + arrow._M_string_length),this->size,'^'
            );
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&arrow,"\x1b[m\n");
  std::operator+(&local_98,&temp1,&arrow);
  psVar3 = local_78;
  std::operator+(local_78,&local_98,&temp2);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&arrow);
  std::__cxx11::string::~string((string *)&temp2);
  std::__cxx11::string::~string((string *)&temp1);
  return psVar3;
}

Assistant:

[[nodiscard]] std::string get_code() const
    {
      std::size_t lineno = code->get_lineno(pos);
      std::size_t linenosize = utils::to_str(lineno + next).size();
      std::size_t actual_last = last;
      std::size_t actual_next = next;
      std::size_t total_line = code->get_lineno(code->size() - 1);
    
      while (static_cast<int>(lineno) - static_cast<int>(actual_last) <= 0 && actual_last > 0)
      {
        --actual_last;
      }
      while (lineno + actual_next >= total_line && actual_next > 0)
      {
        --actual_next;
      }
      
      std::string temp1, temp2;
      //lineno - actual_last is impossible to be equal lineno + 1
      temp1 = code->get_spec_line(lineno - actual_last, lineno + 1, linenosize);//[beg, end)
      if (actual_next != 0)
      {//lineno + 1 might be equal to lineno + actual_next + 1
        temp2 = code->get_spec_line(lineno + 1, lineno + actual_next + 1, linenosize);
      }
      std::string arrow("\n");
      std::size_t arrowpos = code->get_arrowpos(pos) - size + linenosize;
      arrow += std::string(arrowpos, ' ');
      arrow += "\033[0;32;32m";
      arrow.insert(arrow.end(), size, '^');
      arrow += "\033[m\n";
      return temp1 + arrow + temp2;
    }